

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b-plus-tree.cpp
# Opt level: O1

Node * __thiscall BPTree::search(BPTree *this,float x,bool flag,bool printer)

{
  float fVar1;
  char cVar2;
  int iVar3;
  ostream *poVar4;
  Node *pNVar5;
  long lVar6;
  Node **ppNVar7;
  long lVar8;
  long lVar9;
  
  pNVar5 = this->root;
  cVar2 = pNVar5->IS_LEAF;
  do {
    if (cVar2 != '\0') {
      if (printer) {
        if (0 < pNVar5->size) {
          lVar6 = 0;
          lVar8 = 0;
          do {
            poVar4 = std::ostream::_M_insert<double>
                               ((ostream *)&std::cout,
                                (double)*(float *)((long)&pNVar5->key->key_value + lVar6));
            std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
            lVar8 = lVar8 + 1;
            lVar6 = lVar6 + 0x20;
          } while (lVar8 < pNVar5->size);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
      }
      if (0 < (long)pNVar5->size) {
        lVar6 = 0;
        do {
          fVar1 = *(float *)((long)&pNVar5->key->key_value + lVar6);
          if ((fVar1 == x) && (!NAN(fVar1) && !NAN(x))) {
            if (!flag) {
              return pNVar5;
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Size: ",6);
            poVar4 = std::ostream::_M_insert<unsigned_long>
                               ((ostream *)&std::cout,
                                *(long *)((long)&(pNVar5->key->add_vect).
                                                 super__Vector_base<void_*,_std::allocator<void_*>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish + lVar6)
                                - *(long *)((long)&(pNVar5->key->add_vect).
                                                                                                      
                                                  super__Vector_base<void_*,_std::allocator<void_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + lVar6)
                                >> 3);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
            printf("Number of Data Blocks: %d",
                   *(long *)((long)&(pNVar5->key->add_vect).
                                    super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                    super__Vector_impl_data._M_finish + lVar6) -
                   *(long *)((long)&(pNVar5->key->add_vect).
                                    super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                    super__Vector_impl_data._M_start + lVar6) >> 3);
            putchar(10);
            return pNVar5;
          }
          lVar6 = lVar6 + 0x20;
        } while ((long)pNVar5->size * 0x20 != lVar6);
      }
      return (Node *)0x0;
    }
    iVar3 = pNVar5->size;
    if (0 < (long)iVar3) {
      lVar6 = 0;
      do {
        if (x < (&pNVar5->key->key_value)[lVar6]) {
          if (printer) {
            if (0 < pNVar5->size) {
              lVar8 = 0;
              lVar9 = 0;
              do {
                poVar4 = std::ostream::_M_insert<double>
                                   ((ostream *)&std::cout,
                                    (double)*(float *)((long)&pNVar5->key->key_value + lVar8));
                std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
                lVar9 = lVar9 + 1;
                lVar8 = lVar8 + 0x20;
              } while (lVar9 < pNVar5->size);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
          }
          ppNVar7 = (Node **)(lVar6 + (long)pNVar5->ptr);
LAB_001195d4:
          pNVar5 = *ppNVar7;
          break;
        }
        if ((ulong)(iVar3 - 1) * 8 - lVar6 == 0) {
          if (printer) {
            if (0 < pNVar5->size) {
              lVar6 = 0;
              lVar8 = 0;
              do {
                poVar4 = std::ostream::_M_insert<double>
                                   ((ostream *)&std::cout,
                                    (double)*(float *)((long)&pNVar5->key->key_value + lVar6));
                std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
                lVar8 = lVar8 + 1;
                lVar6 = lVar6 + 0x20;
              } while (lVar8 < pNVar5->size);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
          }
          ppNVar7 = pNVar5->ptr + (ulong)(iVar3 - 1) + 1;
          goto LAB_001195d4;
        }
        lVar6 = lVar6 + 8;
      } while ((long)iVar3 * 8 != lVar6);
    }
    cVar2 = pNVar5->IS_LEAF;
  } while( true );
}

Assistant:

Node* search(float x, bool flag, bool printer)
    {
        //search logic
        if(root==NULL)
        {
            //empty
            //cout<<"Tree empty\n";
        }
        else
        {
            Node* cursor = root;
            //in the following while loop, cursor will travel to the leaf node possibly consisting the key
            while(cursor->IS_LEAF == false)
            {
                for(int i = 0; i < cursor->size; i++)
                {
                    if(x < cursor->key[i].key_value)
                    {
                        if (printer == true) {
                            for (int j = 0; j < cursor->size; j++) {
                                cout << cursor->key[j].key_value << " ";
                            }
                            cout << "\n";
                        }
                        cursor = cursor->ptr[i];
                        break;
                    }
                    if(i == cursor->size - 1)
                    {
                        if (printer == true) {
                            for (int j = 0; j < cursor->size; j++) {
                                cout << cursor->key[j].key_value << " ";
                            }
                            cout << "\n";
                        }
                        cursor = cursor->ptr[i+1];
                        break;
                    }
                }
            }
            //in the following for loop, we search for the key if it exists
            if (printer == true) {
                for (int j = 0; j < cursor->size; j++) {
                    cout << cursor->key[j].key_value << " ";
                }
                cout << "\n";
            }
            for(int i = 0; i < cursor->size; i++)
            {
                if(cursor->key[i].key_value == x)
                {
                    //cout<<"Found\n";
                    if (flag == true) {
                        cout <<"Size: "<< cursor->key[i].add_vect.size() << "\n";
                        printf("Number of Data Blocks: %d", cursor->key[i].add_vect.size());
                        printf("\n");
                        for (int j = 0; j < cursor->key[i].add_vect.size(); ++j) {
                            //printf("Data Block: ");
                            //printf("%p", (uchar *) cursor->key[i].add_vect[j]);
                            //printf("\n");
                            //printf("tconst: ");
                            //cout << (*(Record *) cursor->key[i].add_vect[j]).tconst << "\n";
                        }
                    }
                    return cursor;
                }
            }
            //cout<<"Not found\n";
            return nullptr;
        }
    }